

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::EncodeParameters
          (AttributeQuantizationTransform *this,EncoderBuffer *encoder_buffer)

{
  bool bVar1;
  size_t in_RSI;
  AttributeQuantizationTransform *in_RDI;
  AttributeQuantizationTransform *data;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  data = in_RDI;
  bVar1 = is_initialized(in_RDI);
  if (bVar1) {
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x20e4ba);
    std::vector<float,_std::allocator<float>_>::size(&in_RDI->min_values_);
    EncoderBuffer::Encode
              ((EncoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),data,
               in_RSI);
    EncoderBuffer::Encode<float>
              ((EncoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (float *)data);
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (uchar *)data);
  }
  return bVar1;
}

Assistant:

bool AttributeQuantizationTransform::EncodeParameters(
    EncoderBuffer *encoder_buffer) const {
  if (is_initialized()) {
    encoder_buffer->Encode(min_values_.data(),
                           sizeof(float) * min_values_.size());
    encoder_buffer->Encode(range_);
    encoder_buffer->Encode(static_cast<uint8_t>(quantization_bits_));
    return true;
  }
  return false;
}